

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_type sVar1;
  _Map_pointer ppiVar2;
  bool bVar3;
  int iVar4;
  mapped_type *pmVar5;
  int *piVar6;
  long lVar7;
  long *plVar8;
  undefined8 uVar9;
  AudioLogger audioLogger;
  thread keyReader;
  size_t totalSize_bytes;
  time_point tEnd;
  time_point tStart;
  Callback cbAudio;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> nTimes;
  Parameters parameters;
  deque<int,_std::allocator<int>_> keyPressedQueue;
  ofstream fout;
  AudioLogger local_3d8;
  long local_3d0;
  thread local_3c8;
  undefined8 local_3c0;
  undefined8 local_3b8;
  time_point local_3b0;
  key_type local_3a8;
  key_type local_388;
  _Any_data local_368;
  undefined1 local_358 [24];
  anon_class_24_3_f7923e7b_for__M_head_impl local_340;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_328;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_2f8;
  _Any_data local_2c8;
  undefined1 local_2b8 [16];
  undefined4 local_2a8;
  undefined4 uStack_2a4;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined4 local_290;
  undefined1 local_288 [32];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_230 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [14];
  ios_base local_138 [264];
  
  printf("Usage: %s output.kbd [-cN]\n",*argv);
  puts("    -cN - select capture device N");
  puts("    -CN - number N of capture channels N");
  putchar(10);
  if (argc < 2) {
    return -0x7f;
  }
  parseCmdArguments_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_328,argc,argv);
  local_230._0_8_ = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"c","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_328,(key_type *)local_230);
  sVar1 = pmVar5->_M_string_length;
  lVar7 = 0;
  if (sVar1 == 0) {
LAB_0011308f:
    local_3d0 = lVar7;
    if ((sVar1 != 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2)) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._0_8_ != local_220) {
      operator_delete((void *)local_230._0_8_,local_220[0]._M_allocated_capacity + 1);
    }
    local_230._0_8_ = local_220;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"C","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_328,(key_type *)local_230);
    sVar1 = pmVar5->_M_string_length;
    lVar7 = 0;
    if (sVar1 == 0) {
LAB_001131b2:
      if ((sVar1 != 0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2)) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._0_8_ != local_220) {
        operator_delete((void *)local_230._0_8_,local_220[0]._M_allocated_capacity + 1);
      }
      local_3b0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      local_3b8 = std::chrono::_V2::system_clock::now();
      local_3c0 = 0;
      local_248 = (undefined1  [16])0x0;
      local_258 = (undefined1  [16])0x0;
      local_268 = (undefined1  [16])0x0;
      local_288._16_16_ = (undefined1  [16])0x0;
      local_288._0_16_ = (undefined1  [16])0x0;
      std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
                ((_Deque_base<int,_std::allocator<int>_> *)local_288,0);
      local_2f8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_2f8._M_impl.super__Rb_tree_header._M_header;
      local_2f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_2f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_2f8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_2f8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_2f8._M_impl.super__Rb_tree_header._M_header._M_left;
      printf("Recording %d frames per key press\n",0xb);
      std::ofstream::ofstream(local_230,argv[1],_S_bin);
      std::ostream::write(local_230,0x11d01c);
      AudioLogger::AudioLogger(&local_3d8);
      local_358._0_16_ = (undefined1  [16])0x0;
      local_368 = (_Any_data)0x0;
      plVar8 = (long *)operator_new(0x28);
      *plVar8 = (long)&local_3b8;
      plVar8[1] = (long)local_288;
      plVar8[2] = (long)local_230;
      plVar8[3] = (long)&local_3c0;
      plVar8[4] = (long)&local_2f8;
      local_368._M_unused._M_object = plVar8;
      local_358._8_8_ =
           std::
           _Function_handler<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/record.cpp:47:37)>
           ::_M_invoke;
      local_358._0_8_ =
           std::
           _Function_handler<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/record.cpp:47:37)>
           ::_M_manager;
      local_2b8 = (undefined1  [16])0x0;
      local_2c8 = (_Any_data)0x0;
      local_2a8 = 0xffffffff;
      uStack_2a4 = 0xffffffff;
      uStack_2a0 = 0xffffffffffffffff;
      local_298 = 0x100000000;
      local_290 = 0x447a0000;
      std::
      function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
      ::operator=((function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
                   *)&local_2c8,
                  (function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
                   *)&local_368);
      local_2a8 = (undefined4)local_3d0;
      uStack_2a4 = (undefined4)lVar7;
      uStack_2a0 = 16000;
      local_290 = 0x42c80000;
      bVar3 = AudioLogger::install(&local_3d8,(Parameters *)&local_2c8);
      if (!bVar3) {
        fwrite("Failed to install audio logger\n",0x1f,1,_stderr);
        if ((code *)local_2b8._0_8_ != (code *)0x0) {
          (*(code *)local_2b8._0_8_)(&local_2c8,&local_2c8,__destroy_functor);
        }
        if ((code *)local_358._0_8_ != (code *)0x0) {
          (*(code *)local_358._0_8_)(&local_368,&local_368,__destroy_functor);
        }
        AudioLogger::~AudioLogger(&local_3d8);
        local_230._0_8_ = _VTT;
        *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _SDL_GetNumAudioDevices;
        std::filebuf::~filebuf((filebuf *)(local_230 + 8));
        std::ios_base::~ios_base(local_138);
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree(&local_2f8);
        std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                  ((_Deque_base<int,_std::allocator<int>_> *)local_288);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_328);
        return -1;
      }
      putchar(10);
      puts("To stop capturing press Ctrl+C");
      puts(
          "On some systems (e.g. MacOS), this may not work. In this case, you have to kill the process manually"
          );
      putchar(10);
      local_340.tStart = &local_3b0;
      local_340.keyPressedQueue = (deque<int,_std::allocator<int>_> *)local_288;
      local_340.audioLogger = &local_3d8;
      std::thread::thread<main::__1,,void>(&local_3c8,&local_340);
      do {
        local_340.tStart = (time_point *)0x0;
        local_340.keyPressedQueue = (deque<int,_std::allocator<int>_> *)0x5f5e100;
        do {
          iVar4 = nanosleep((timespec *)&local_340,(timespec *)&local_340);
          if (iVar4 != -1) break;
          piVar6 = __errno_location();
        } while (*piVar6 == 4);
      } while( true );
    }
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"C","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_328,&local_3a8);
    ppiVar2 = (_Map_pointer)(pmVar5->_M_dataplus)._M_p;
    piVar6 = __errno_location();
    iVar4 = *piVar6;
    *piVar6 = 0;
    lVar7 = strtol((char *)ppiVar2,(char **)local_288,10);
    if ((_Map_pointer)local_288._0_8_ != ppiVar2) {
      if (((int)lVar7 == lVar7) && (*piVar6 != 0x22)) {
        if (*piVar6 == 0) {
          *piVar6 = iVar4;
        }
        goto LAB_001131b2;
      }
      goto LAB_0011350d;
    }
  }
  else {
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"c","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_328,&local_388);
    ppiVar2 = (_Map_pointer)(pmVar5->_M_dataplus)._M_p;
    piVar6 = __errno_location();
    iVar4 = *piVar6;
    *piVar6 = 0;
    lVar7 = strtol((char *)ppiVar2,(char **)local_288,10);
    if ((_Map_pointer)local_288._0_8_ == ppiVar2) {
      std::__throw_invalid_argument("stoi");
    }
    else if (((int)lVar7 == lVar7) && (*piVar6 != 0x22)) {
      if (*piVar6 == 0) {
        *piVar6 = iVar4;
      }
      goto LAB_0011308f;
    }
    std::__throw_out_of_range("stoi");
  }
  std::__throw_invalid_argument("stoi");
LAB_0011350d:
  uVar9 = std::__throw_out_of_range("stoi");
  __clang_call_terminate(uVar9);
}

Assistant:

int main(int argc, char ** argv) {
    printf("Usage: %s output.kbd [-cN]\n", argv[0]);
    printf("    -cN - select capture device N\n");
    printf("    -CN - number N of capture channels N\n");
    printf("\n");

    if (argc < 2) {
        return -127;
    }

    auto argm = parseCmdArguments(argc, argv);
    int captureId = argm["c"].empty() ? 0 : std::stoi(argm["c"]);
    int nChannels = argm["C"].empty() ? 0 : std::stoi(argm["C"]);

    auto tStart = std::chrono::high_resolution_clock::now();
    auto tEnd = std::chrono::high_resolution_clock::now();

    size_t totalSize_bytes = 0;
    std::deque<int> keyPressedQueue;
    std::map<int, int> nTimes;
    printf("Recording %d frames per key press\n", kBufferSizeTrain_frames);

    std::ofstream fout(argv[1], std::ios::binary);
    fout.write((char *)(&kBufferSizeTrain_frames), sizeof(kBufferSizeTrain_frames));

    AudioLogger audioLogger;
    AudioLogger::Callback cbAudio = [&](const auto & frames) {
        tEnd = std::chrono::high_resolution_clock::now();

        int keyPressed = keyPressedQueue.front();
        keyPressedQueue.pop_front();

        fout.write((char *)(&keyPressed), sizeof(keyPressed));
        for (const auto & frame : frames) {
            totalSize_bytes += sizeof(frame[0])*frame.size();
            fout.write((char *)(frame.data()), sizeof(frame[0])*frame.size());
            fout.flush();
        }
        ++nTimes[keyPressed];

        printf("Last recorded key - %3d '%s'. Total times recorded so far - %3d. Total data saved: %g MB\n",
               keyPressed, kKeyText.at(keyPressed), nTimes[keyPressed], ((float)(totalSize_bytes)/1024.0f/1024.0f));

        keyPressed = -1;
    };

    AudioLogger::Parameters parameters;
    parameters.callback = std::move(cbAudio);
    parameters.captureId = captureId;
    parameters.nChannels = nChannels;
    parameters.sampleRate = kSampleRate;
    parameters.freqCutoff_Hz = kFreqCutoff_Hz;

    if (audioLogger.install(std::move(parameters)) == false) {
        fprintf(stderr, "Failed to install audio logger\n");
        return -1;
    }

    printf("\n");
    printf("To stop capturing press Ctrl+C\n");
    printf("On some systems (e.g. MacOS), this may not work. In this case, you have to kill the process manually\n");
    printf("\n");

    std::thread keyReader = std::thread([&]() {
        struct termios oldt, newt;
        tcgetattr ( STDIN_FILENO, &oldt );
        newt = oldt;
        newt.c_lflag &= ~( ICANON | ECHO );
        tcsetattr ( STDIN_FILENO, TCSANOW, &newt );
        while (true) {
            int key = getchar();
            tStart = std::chrono::high_resolution_clock::now();
            keyPressedQueue.push_back(key);
            if (audioLogger.record(kBufferSizeTrain_s, 2) == false) {
                fprintf(stderr, "error : failed to record\n");
            }
        }
        tcsetattr ( STDIN_FILENO, TCSANOW, &oldt );
    });

    while (true) {
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
    }

    keyReader.join();

    fout.close();

    return 0;
}